

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adksys_procfs.c
# Opt level: O3

int adksys_starttime(timeval *tv)

{
  int iVar1;
  stat buf;
  stat sStack_98;
  
  tv->tv_sec = 0;
  tv->tv_usec = 0;
  iVar1 = stat("/proc/self",&sStack_98);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    tv->tv_sec = sStack_98.st_mtim.tv_sec;
    tv->tv_usec = sStack_98.st_mtim.tv_nsec / 1000;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int adksys_starttime(struct timeval *tv)
{
   struct stat buf;
   int result;
   tv->tv_sec = tv->tv_usec = 0;
   result = stat("/proc/self", &buf);
   if (result == -1)
      return -1;

   tv->tv_sec = buf.st_mtime;
   tv->tv_usec = buf.st_mtim.tv_nsec / 1000;
   return 0;
}